

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O2

bool asmjit::v1_14::x86::x86ShouldUseMovabs
               (Assembler *self,X86BufferWriter *writer,uint32_t regSize,InstOptions options,
               Mem *rmRel)

{
  uint uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  if (((self->super_BaseAssembler).super_BaseEmitter._environment._arch & k32BitMask) != kUnknown) {
    return (options & (kX86_ModRM|kX86_ModMR)) == kNone;
  }
  uVar1 = (rmRel->super_BaseMem).super_Operand.super_Operand_._signature._bits;
  uVar5 = uVar1 >> 0xe & 3;
  if ((options & (kX86_ModRM|kX86_ModMR)) == kNone && uVar5 != 2) {
    uVar2 = (rmRel->super_BaseMem).super_Operand.super_Operand_._data[1];
    uVar7 = CONCAT44((rmRel->super_BaseMem).super_Operand.super_Operand_._baseId,uVar2);
    if ((uVar1 & 0xf8) != 0) {
      uVar7 = (long)(int)uVar2;
    }
    uVar3 = ((self->super_BaseAssembler).super_BaseEmitter._code)->_baseAddress;
    if ((uVar5 == 0 && (uVar1 & 0x1c0000) == 0) && uVar3 != 0xffffffffffffffff) {
      iVar6 = -1;
      if (regSize != 8) {
        iVar6 = (int)(options * 2) >> 0x1f;
      }
      sVar4 = CodeWriter::offsetFrom
                        (&writer->super_CodeWriter,(self->super_BaseAssembler)._bufferData);
      if (((iVar6 + (regSize == 2 ^ 0xfffffff7) + 0x80000000) + uVar7) -
          (uVar3 + sVar4 + ((self->super_BaseAssembler)._section)->_offset) >> 0x20 != 0)
      goto LAB_0013cce7;
    }
    else if ((long)(int)uVar7 != uVar7) {
LAB_0013cce7:
      return uVar7 >> 0x20 != 0;
    }
  }
  return false;
}

Assistant:

static ASMJIT_FORCE_INLINE bool x86ShouldUseMovabs(Assembler* self, X86BufferWriter& writer, uint32_t regSize, InstOptions options, const Mem& rmRel) noexcept {
  if (self->is32Bit()) {
    // There is no relative addressing, just decide whether to use MOV encoded with MOD R/M or absolute.
    return !Support::test(options, InstOptions::kX86_ModMR | InstOptions::kX86_ModRM);
  }
  else {
    // If the addressing type is REL or MOD R/M was specified then absolute mov won't be used.
    if (rmRel.addrType() == Mem::AddrType::kRel || Support::test(options, InstOptions::kX86_ModMR | InstOptions::kX86_ModRM))
      return false;

    int64_t addrValue = rmRel.offset();
    uint64_t baseAddress = self->code()->baseAddress();

    // If the address type is default, it means to basically check whether relative addressing is possible. However,
    // this is only possible when the base address is known - relative encoding uses RIP+N it has to be calculated.
    if (rmRel.addrType() == Mem::AddrType::kDefault && baseAddress != Globals::kNoBaseAddress && !rmRel.hasSegment()) {
      uint32_t instructionSize = x86GetMovAbsInstSize64Bit(regSize, options, rmRel);
      uint64_t virtualOffset = uint64_t(writer.offsetFrom(self->_bufferData));
      uint64_t rip64 = baseAddress + self->_section->offset() + virtualOffset + instructionSize;
      uint64_t rel64 = uint64_t(addrValue) - rip64;

      if (Support::isInt32(int64_t(rel64)))
        return false;
    }
    else {
      if (Support::isInt32(addrValue))
        return false;
    }

    return uint64_t(addrValue) > 0xFFFFFFFFu;
  }
}